

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::Thread(Thread *this,ThreadFunc *func,string *n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  function<void_()> *in_RDI;
  int count;
  Thread *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  (in_RDI->super__Function_base)._M_functor._M_pod_data[0] = '\0';
  (in_RDI->super__Function_base)._M_functor._M_pod_data[1] = '\0';
  *(undefined8 *)((long)&(in_RDI->super__Function_base)._M_functor + 8) = 0;
  *(undefined4 *)&(in_RDI->super__Function_base)._M_manager = 0;
  __str = in_RDX;
  std::function<void_()>::function(in_RDI,(function<void_()> *)&in_RDI->_M_invoker);
  count = (int)((ulong)in_RDX >> 0x20);
  this_00 = (Thread *)&in_RDI[1]._M_invoker;
  std::__cxx11::string::string(in_RSI,__str);
  CountDownLatch::CountDownLatch((CountDownLatch *)this_00,count);
  setDefaultName(this_00);
  return;
}

Assistant:

Thread::Thread(const ThreadFunc& func, const string n)
        :started_(false), joined_(false), pthreadId_(0),
        tid_(0), func_(func), name_(n), latch_(1){
            setDefaultName();
}